

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

int ON_Buffer::Compare(ON_Buffer *a,ON_Buffer *b)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  ulong local_88;
  size_t sStack_78;
  int rc;
  size_t sz;
  size_t bsize;
  size_t asize;
  size_t bsegsize;
  size_t asegsize;
  size_t boffset;
  size_t aoffset;
  ON__UINT64 size;
  ON__UINT64 buffer_size;
  ON_BUFFER_SEGMENT *bseg;
  ON_BUFFER_SEGMENT *aseg;
  ON_Buffer *b_local;
  ON_Buffer *a_local;
  
  if (a == b) {
    a_local._4_4_ = 0;
  }
  else if (a->m_buffer_size < b->m_buffer_size) {
    a_local._4_4_ = -1;
  }
  else if (b->m_buffer_size < a->m_buffer_size) {
    a_local._4_4_ = 1;
  }
  else {
    bseg = a->m_first_segment;
    buffer_size = (ON__UINT64)b->m_first_segment;
    uVar1 = a->m_buffer_size;
    aoffset = 0;
    boffset = 0;
    asegsize = 0;
    bsegsize = 0;
    asize = 0;
LAB_005ea5a3:
    bVar3 = false;
    if ((bseg != (ON_BUFFER_SEGMENT *)0x0) && (bVar3 = false, buffer_size != 0)) {
      bVar3 = aoffset < uVar1;
    }
    if (!bVar3) {
      return 0;
    }
    if (bsegsize == 0) {
      if (bseg->m_segment_position1 <= bseg->m_segment_position0) {
        bseg = bseg->m_next_segment;
        goto LAB_005ea5a3;
      }
      bsegsize = bseg->m_segment_position1 - bseg->m_segment_position0;
      boffset = 0;
    }
    if (asize == 0) {
      if (*(ulong *)(buffer_size + 0x10) < *(ulong *)(buffer_size + 0x18)) {
        asize = *(long *)(buffer_size + 0x18) - *(long *)(buffer_size + 0x10);
        asegsize = 0;
        goto LAB_005ea662;
      }
      buffer_size = *(ON__UINT64 *)(buffer_size + 8);
      goto LAB_005ea5a3;
    }
LAB_005ea662:
    if (bsegsize <= boffset) {
      bsegsize = 0;
      bseg = bseg->m_next_segment;
      goto LAB_005ea5a3;
    }
    if (asize <= asegsize) {
      asize = 0;
      buffer_size = *(ON__UINT64 *)(buffer_size + 8);
      goto LAB_005ea5a3;
    }
    if (bseg->m_segment_buffer == (uchar *)0x0) {
      if (*(long *)(buffer_size + 0x20) != 0) {
        return -1;
      }
      return 0;
    }
    if (*(long *)(buffer_size + 0x20) == 0) {
      return 1;
    }
    local_88 = asize - asegsize;
    if (bsegsize - boffset <= local_88) {
      local_88 = bsegsize - boffset;
    }
    sStack_78 = local_88;
    if (uVar1 < aoffset + local_88) {
      sStack_78 = uVar1 - aoffset;
    }
    iVar2 = memcmp(bseg->m_segment_buffer + boffset,
                   (void *)(*(long *)(buffer_size + 0x20) + asegsize),sStack_78);
    if (iVar2 == 0) {
      boffset = sStack_78 + boffset;
      asegsize = sStack_78 + asegsize;
      aoffset = sStack_78 + aoffset;
      goto LAB_005ea5a3;
    }
    a_local._4_4_ = 1;
    if (iVar2 < 0) {
      a_local._4_4_ = -1;
    }
  }
  return a_local._4_4_;
}

Assistant:

int ON_Buffer::Compare( const ON_Buffer& a, const ON_Buffer& b )
{
  if ( &a == &b )
    return 0;
  if ( a.m_buffer_size < b.m_buffer_size )
    return -1;
  if ( a.m_buffer_size > b.m_buffer_size )
    return 1;

  struct ON_BUFFER_SEGMENT* aseg = a.m_first_segment;
  struct ON_BUFFER_SEGMENT* bseg = b.m_first_segment;
  const ON__UINT64 buffer_size = a.m_buffer_size;
  ON__UINT64 size = 0;
  size_t aoffset = 0;
  size_t boffset = 0;
  size_t asegsize = 0;
  size_t bsegsize = 0;  
  size_t asize = 0;
  size_t bsize = 0;  
  size_t sz;
  int rc = 0;

  while ( 0 != aseg && 0 != bseg && size < buffer_size )
  {
    if ( 0 == asegsize )
    {
      if ( aseg->m_segment_position0 >= aseg->m_segment_position1 )
      {
        aseg = aseg->m_next_segment;
        continue;
      }
      asegsize = (size_t)(aseg->m_segment_position1 - aseg->m_segment_position0);
      aoffset = 0;
    }

    if ( 0 == bsegsize )
    {
      if ( bseg->m_segment_position0 >= bseg->m_segment_position1 )
      {
        bseg = bseg->m_next_segment;
        continue;
      }
      bsegsize = (size_t)(bseg->m_segment_position1 - bseg->m_segment_position0);
      boffset = 0;
    }
    
    if ( aoffset >= asegsize )
    {
      asegsize = 0;
      aseg = aseg->m_next_segment;
      continue;
    }

    if ( boffset >= bsegsize )
    {
      bsegsize = 0;
      bseg = bseg->m_next_segment;
      continue;
    }

    if ( 0 == aseg->m_segment_buffer )
    {
      return (0 == bseg->m_segment_buffer) ? 0 : -1;
    }

    if ( 0 == bseg->m_segment_buffer )
    {
      return 1;
    }

    asize = asegsize - aoffset;
    bsize = bsegsize - boffset;
    sz = (asize <= bsize) ? asize : bsize;
    if ( size + sz > buffer_size )
      sz = (size_t)(buffer_size - size);
    rc = memcmp( aseg->m_segment_buffer + aoffset, bseg->m_segment_buffer + boffset, (size_t)sz );
    if ( 0 != rc )
      return ((rc<0)?-1:1);
    aoffset += sz;
    boffset += sz;
    size += sz;
  }

  return 0;
}